

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

void llb_build_key_get_custom_task_data(llb_build_key_t *key,llb_data_t *out_task_data)

{
  BuildKey *this;
  char *pcVar1;
  string local_50;
  undefined1 local_30 [8];
  StringRef data;
  llb_data_t *out_task_data_local;
  llb_build_key_t *key_local;
  
  data.Length = (size_t)out_task_data;
  this = anon_unknown.dwarf_1e10c2::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  _local_30 = llbuild::buildsystem::BuildKey::getCustomTaskData(this);
  *(char **)data.Length = data.Data;
  llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  *(char **)(data.Length + 8) = pcVar1;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void llb_build_key_get_custom_task_data(llb_build_key_t *key, llb_data_t *out_task_data) {
  auto data = ((CAPIBuildKey *)key)->getInternalBuildKey().getCustomTaskData();
  out_task_data->length = data.size();
  out_task_data->data = (const uint8_t*)strdup(data.str().c_str());
}